

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestArrObj::Serialize(TestArrObj *this,CJSON *json)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"str",&local_39);
  CJSON::AddPair<std::__cxx11::string>(json,&local_38,&this->str);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Serialize(CJSON &json) const 
    {
        json.AddPair("str", str);
    }